

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_tests.hpp
# Opt level: O1

void __thiscall LogChecker::~LogChecker(LogChecker *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char **in_R9;
  AssertionResult iutest_ar;
  allocator<char> local_1f1;
  AssertionResult local_1f0;
  AssertionHelper local_1c8;
  undefined1 local_198 [392];
  
  iutest::detail::iuConsole::GetLoggerInstanceVariable()::sLogger = 0;
  local_198._0_8_ = (this->super_LogCheckerBase).m_str._M_dataplus._M_p;
  local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p =
       (this->printer_logger).m_log._M_dataplus._M_p;
  iuutil::StrInHelper::Assertion<char_const*,char_const*>
            (&local_1f0,(StrInHelper *)"m_str.c_str()","printer_logger.c_str()",local_198,
             (char **)&local_1c8,in_R9);
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1f1);
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/logger_tests.hpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x4c;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != &local_1f0.m_message.field_2) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  (this->printer_logger).m_log._M_string_length = 0;
  *(this->printer_logger).m_log._M_dataplus._M_p = '\0';
  (this->printer_logger).super_iuLogger._vptr_iuLogger = (_func_int **)&PTR__TestLogger_0015e198;
  pcVar1 = (this->printer_logger).m_log._M_dataplus._M_p;
  paVar2 = &(this->printer_logger).m_log.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->super_LogCheckerBase).m_str._M_dataplus._M_p;
  paVar2 = &(this->super_LogCheckerBase).m_str.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

~LogChecker(void)
    {
        ::iutest::detail::iuConsole::SetLogger(NULL);
        IUTEST_EXPECT_STRIN(m_str.c_str(), printer_logger.c_str());
        printer_logger.clear();
    }